

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_contains_which(set dest,set src,set_key *key)

{
  set_cb_iterate in_RDX;
  set in_RSI;
  set_contains_which_cb_iterator_type args;
  undefined8 uVar1;
  
  uVar1 = 0;
  set_iterate(in_RSI,in_RDX,(set_cb_iterate_args)0x0);
  *(undefined8 *)in_RDX = uVar1;
  return 1;
}

Assistant:

int set_contains_which(set dest, set src, set_key *key)
{
	struct set_contains_which_cb_iterator_type args;

	args.s = dest;
	args.result = 1;
	args.key = NULL;

	set_iterate(src, &set_contains_which_cb_iterate, (set_cb_iterate_args)&args);

	/* Return which is the duplicated key if any */
	*key = args.key;

	return args.result;
}